

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_capacity_valid_fn(int _i)

{
  size_t sVar1;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray array;
  int _i_local;
  
  array.buffer._4_4_ = _i;
  memset(&_ck_x,0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  array.capacity = 0;
  array.deallocator = (ACUtilsDeallocator)0x0;
  array.size = 0x2a;
  sVar1 = private_ACUtils_ADynArray_capacity(&_ck_x);
  if (sVar1 != 0x2a) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x9c,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_capacity(&array) == 42",
                      "private_ACUtils_ADynArray_capacity(&array)",sVar1,"42",0x2a,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x9c);
  array.size = 0xd;
  sVar1 = private_ACUtils_ADynArray_capacity(&_ck_x);
  if (sVar1 == 0xd) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x9e);
    array.size = 0;
    sVar1 = private_ACUtils_ADynArray_capacity(&_ck_x);
    if (sVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xa0);
      return;
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xa0,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_capacity(&array) == 0",
                      "private_ACUtils_ADynArray_capacity(&array)",sVar1,"0",0,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x9e,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "private_ACUtils_ADynArray_capacity(&array) == 13",
                    "private_ACUtils_ADynArray_capacity(&array)",sVar1,"13",0xd,0);
}

Assistant:

START_TEST(test_ADynArray_capacity_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {nullptr, nullptr};
    array.size = 0;
    array.buffer = nullptr;
    array.growStrategy = nullptr;
    array.capacity = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 42);
    array.capacity = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 13);
    array.capacity = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_capacity(&array), 0);
}